

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O1

void nrg::InstantExecution::
     push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>
               (Queue *queue,
               _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_4)

{
  pointer pcVar1;
  QueueElement elem;
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  undefined1 local_40 [16];
  long *local_30;
  long local_20 [2];
  
  local_40._8_8_ = param->_M_data;
  pcVar1 = (param_4->_M_dataplus)._M_p;
  local_40._0_8_ = fn;
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + param_4->_M_string_length);
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>&&,std::__cxx11::string&&)::_lambda()_1_,void>
            ((function<void()> *)local_60._M_pod_data,(anon_class_48_3_7e084ec6 *)local_40);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  std::function<void_()>::function((function<void_()> *)&local_80,(function<void_()> *)&local_60);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,
             (function<void_()> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }